

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

Vec_Ptr_t * Aig_ManRegPartitionSmart(Aig_Man_t *pAig,int nPartSize)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Aig_ManPre_t *p;
  int *piVar5;
  void *__dest;
  void **ppvVar6;
  long lVar7;
  
  p = Aig_ManRegManStart(pAig,nPartSize);
  iVar4 = Aig_ManRegFindSeed(p);
  do {
    if (iVar4 < 0) {
      pVVar2 = p->vParts;
      p->vParts = (Vec_Ptr_t *)0x0;
      Aig_ManRegManStop(p);
      return pVVar2;
    }
    p->vRegs->nSize = 0;
    p->vUniques->nSize = 0;
    p->vFreeVars->nSize = 0;
    p->vPartCost->nSize = 0;
    memset(p->pfPartVars,0,(long)p->pAig->nRegs);
    Aig_ManRegPartitionAdd(p,iVar4);
    do {
      if ((p->nRegsMax <= p->vRegs->nSize) || (iVar4 = Aig_ManRegFindBestVar(p), iVar4 == -1))
      break;
      Aig_ManRegPartitionAdd(p,iVar4);
    } while (p->vFreeVars->nSize != 0);
    pVVar2 = p->vParts;
    pVVar3 = p->vRegs;
    piVar5 = (int *)malloc(0x10);
    iVar4 = pVVar3->nSize;
    lVar7 = (long)iVar4;
    piVar5[1] = iVar4;
    *piVar5 = iVar4;
    if (lVar7 == 0) {
      __dest = (void *)0x0;
    }
    else {
      __dest = malloc(lVar7 * 4);
    }
    *(void **)(piVar5 + 2) = __dest;
    memcpy(__dest,pVVar3->pArray,lVar7 << 2);
    uVar1 = pVVar2->nCap;
    if (pVVar2->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
        }
        pVVar2->pArray = ppvVar6;
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar1 * 2;
        if (iVar4 <= (int)uVar1) goto LAB_006378a1;
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
        }
        pVVar2->pArray = ppvVar6;
      }
      pVVar2->nCap = iVar4;
    }
LAB_006378a1:
    iVar4 = pVVar2->nSize;
    pVVar2->nSize = iVar4 + 1;
    pVVar2->pArray[iVar4] = piVar5;
    printf("Part %3d  SUMMARY:  Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n",
           (double)p->vFreeVars->nSize / (double)p->vRegs->nSize);
    iVar4 = Aig_ManRegFindSeed(p);
  } while( true );
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionSmart( Aig_Man_t * pAig, int nPartSize )
{
    extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );

    Aig_ManPre_t * p;
    Vec_Ptr_t * vResult;
    int iSeed, iNext, i, k;
    // create the manager
    p = Aig_ManRegManStart( pAig, nPartSize );
    // add partitions as long as registers remain
    for ( i = 0; (iSeed = Aig_ManRegFindSeed(p)) >= 0; i++ )
    {
//printf( "Seed variable = %d.\n", iSeed );
        // clean the current partition information
        Vec_IntClear( p->vRegs );
        Vec_IntClear( p->vUniques );
        Vec_IntClear( p->vFreeVars );
        Vec_FltClear( p->vPartCost );
        memset( p->pfPartVars, 0, sizeof(char) * Aig_ManRegNum(p->pAig) );
        // add the register and its partition support
        Aig_ManRegPartitionAdd( p, iSeed );
        // select the best var to add
        for ( k = 0; Vec_IntSize(p->vRegs) < p->nRegsMax; k++ )
        {
            // get the next best variable
            iNext = Aig_ManRegFindBestVar( p );
            if ( iNext == -1 )
                break;
            // add the register to the support of the partition
            Aig_ManRegPartitionAdd( p, iNext );
            // report the result
//printf( "Part %3d  Reg %3d : Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n", i, k, 
//                Vec_IntSize(p->vFreeVars), Vec_IntSize(p->vRegs), 
//                1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs), Vec_IntSize(p->vUniques) );
            // quit if there are not free variables
            if ( Vec_IntSize(p->vFreeVars) == 0 )
                break;
        }
        // add this partition to the set
        Vec_PtrPush( p->vParts, Vec_IntDup(p->vRegs) );        
printf( "Part %3d  SUMMARY:  Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n", i,
                Vec_IntSize(p->vFreeVars), Vec_IntSize(p->vRegs), 
                1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs), Vec_IntSize(p->vUniques) );
//printf( "\n" ); 
    }
    vResult = p->vParts; p->vParts = NULL;
    Aig_ManRegManStop( p );
    return vResult;
}